

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regalloc.cpp
# Opt level: O0

Error __thiscall asmjit::RAPass::compile(RAPass *this,CCFunc *func)

{
  undefined8 in_RSI;
  long *in_RDI;
  Error err;
  Error _err;
  Error local_48;
  Error local_2c;
  
  local_2c = (**(code **)(*in_RDI + 0x20))(in_RDI,in_RSI);
  if (local_2c == 0) {
    local_48 = (**(code **)(*in_RDI + 0x58))();
    if ((((local_48 == 0) && (local_48 = (**(code **)(*in_RDI + 0x60))(), local_48 == 0)) &&
        (local_48 = (**(code **)(*in_RDI + 0x68))(), local_48 == 0)) &&
       (((*(uint *)(in_RDI[1] + 0x38) & 4) == 0 ||
        (local_48 = (**(code **)(*in_RDI + 0x70))(), local_48 == 0)))) {
      local_48 = (**(code **)(*in_RDI + 0x80))();
    }
    (**(code **)(*in_RDI + 0x28))();
    *(undefined8 *)(in_RDI[1] + 0x178) = 0;
    local_2c = local_48;
  }
  return local_2c;
}

Assistant:

Error RAPass::compile(CCFunc* func) noexcept {
  ASMJIT_PROPAGATE(prepare(func));

  Error err;
  do {
    err = fetch();
    if (err) break;

    err = removeUnreachableCode();
    if (err) break;

    err = livenessAnalysis();
    if (err) break;

#if !defined(ASMJIT_DISABLE_LOGGING)
    if (cc()->getGlobalOptions() & CodeEmitter::kOptionLoggingEnabled) {
      err = annotate();
      if (err) break;
    }
#endif // !ASMJIT_DISABLE_LOGGING

    err = translate();
  } while (false);

  cleanup();

  // We alter the compiler cursor, because it doesn't make sense to reference
  // it after compilation - some nodes may disappear and it's forbidden to add
  // new code after the compilation is done.
  cc()->_setCursor(nullptr);
  return err;
}